

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

void * sx__aligned_alloc(sx_alloc *alloc,size_t size,uint32_t align,char *file,char *func,
                        uint32_t line)

{
  code *pcVar1;
  void *pvVar2;
  ulong uVar3;
  void *pvVar4;
  
  uVar3 = 8;
  if (8 < (int)align) {
    uVar3 = (ulong)align;
  }
  pvVar2 = (*alloc->alloc_cb)((void *)0x0,size + uVar3 + 4,0,file,func,line,alloc->user_data);
  if (pvVar2 == (void *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                      ,0xb0,"ptr");
    pcVar1 = (code *)swi(3);
    pvVar2 = (void *)(*pcVar1)();
    return pvVar2;
  }
  uVar3 = (ulong)((int)uVar3 - 1);
  pvVar4 = (void *)(~uVar3 & (long)pvVar2 + uVar3 + 4);
  *(int *)((long)pvVar4 + -4) = (int)pvVar4 - (int)pvVar2;
  return pvVar4;
}

Assistant:

SX_INLINE void* sx__aligned_alloc(const sx_alloc* alloc, size_t size, uint32_t align, 
                                  const char* file, const char* func, uint32_t line)
{
    align = sx_max((int)align, SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT);
    const size_t total = size + align + sizeof(uint32_t);
    uint8_t* ptr = (uint8_t*)sx__malloc(alloc, total, 0, file, func, line);
    sx_assert(ptr);
    uint8_t* aligned = (uint8_t*)sx_align_ptr(ptr, sizeof(uint32_t), align);
    uint32_t* header = (uint32_t*)aligned - 1;
    *header = (uint32_t)(uintptr_t)(aligned - ptr);
    return aligned;
}